

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosmic_protector.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _List_node_base *p_Var1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  ResourceManager *this;
  Player *pPVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  undefined4 in_register_0000003c;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  bool bVar14;
  double dVar15;
  Wave local_4c;
  void *local_48;
  Player *local_40;
  ResourceManager *local_38;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc);
  bVar14 = 1 < argc;
  if (argc < 2) {
LAB_0010e0ad:
    if (!bVar14) goto LAB_0010e0bb;
  }
  else {
    ctx = (EVP_PKEY_CTX *)argv[1];
    iVar4 = strcmp((char *)ctx,"-fullscreen");
    if (iVar4 != 0) {
      uVar3 = 2;
      do {
        uVar12 = uVar3;
        if ((uint)argc == uVar12) break;
        ctx = (EVP_PKEY_CTX *)argv[uVar12];
        iVar4 = strcmp((char *)ctx,"-fullscreen");
        uVar3 = uVar12 + 1;
      } while (iVar4 != 0);
      bVar14 = uVar12 < (uint)argc;
      goto LAB_0010e0ad;
    }
  }
  useFullScreenMode = true;
LAB_0010e0bb:
  iVar4 = init(ctx);
  if ((char)iVar4 == '\0') {
    debug_message("Error in initialization.\n");
    iVar4 = 1;
  }
  else {
    this = ResourceManager::getInstance();
    pPVar7 = (Player *)ResourceManager::getData(this,1);
    pvVar8 = ResourceManager::getData(this,0x21);
    local_38 = this;
    pvVar9 = ResourceManager::getData(this,0x22);
    while( true ) {
      if (pvVar8 != (void *)0x0) {
        al_set_audio_stream_playing(pvVar8);
      }
      joypad_find();
      do {
        iVar4 = do_menu();
        al_rest(0x3fd0000000000000);
        if ((iVar4 == -1) || (iVar4 == 2)) {
          done();
          iVar5 = 1;
        }
        else {
          iVar5 = 5;
          if (iVar4 == 1) {
            do_highscores(-0x80000000);
            iVar5 = 4;
          }
        }
      } while (iVar5 == 4);
      if (iVar5 != 5) break;
      if (pvVar8 != (void *)0x0) {
        al_drain_audio_stream(pvVar8);
        al_rewind_audio_stream(pvVar8);
      }
      joypad_stop_finding();
      pvVar10 = ResourceManager::getData(local_38,0);
      uVar6 = al_get_display_orientation(pvVar10);
      al_set_display_option(pvVar10,0x20,uVar6);
      if (pvVar9 != (void *)0x0) {
        al_set_audio_stream_playing(pvVar9,1);
      }
      local_48 = pvVar9;
      local_40 = pPVar7;
      (*(pPVar7->super_Entity)._vptr_Entity[8])(pPVar7);
      lastUFO = -1;
      canUFO = true;
      Wave::Wave(&local_4c);
      dVar15 = (double)al_get_time();
      iVar4 = 0;
      lVar13 = (long)(dVar15 * 1000.0);
      while (((entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
               _M_node._M_size != 0 ||
              (bVar14 = Wave::next(&local_4c),
              p_Var1 = entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>.
                       _M_impl._M_node.super__List_node_base._M_next, pvVar2 = local_48, bVar14)) &&
             (bVar14 = logic(iVar4),
             p_Var1 = entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>.
                      _M_impl._M_node.super__List_node_base._M_next, pvVar2 = local_48, bVar14))) {
        render(iVar4);
        al_rest(0x3f91111111111111);
        dVar15 = (double)al_get_time();
        lVar11 = (long)(dVar15 * 1000.0);
        iVar4 = (int)lVar11 - (int)lVar13;
        lVar13 = lVar11;
        if (0x31 < iVar4) {
          iVar4 = 0x32;
        }
      }
      for (; pvVar9 = local_48, local_48 = pvVar2, p_Var1 != (_List_node_base *)&entities_abi_cxx11_
          ; p_Var1 = (((_List_base<Entity_*,_std::allocator<Entity_*>_> *)&p_Var1->_M_next)->_M_impl
                     )._M_node.super__List_node_base._M_next) {
        if (*(long **)(p_Var1 + 1) != (long *)0x0) {
          (**(code **)(**(long **)(p_Var1 + 1) + 0x30))();
        }
        pvVar2 = local_48;
        local_48 = pvVar9;
      }
      std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::clear(&entities_abi_cxx11_);
      pPVar7 = local_40;
      iVar4 = Player::getScore(local_40);
      do_highscores(iVar4);
      (*(pPVar7->super_Entity)._vptr_Entity[7])(pPVar7);
      if (pvVar9 != (void *)0x0) {
        al_drain_audio_stream(pvVar9);
        al_rewind_audio_stream(pvVar9);
      }
      al_set_display_option(pvVar10,0x20,10);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
   if (check_arg(argc, argv, "-fullscreen"))
      useFullScreenMode = true;
   if (!init()) {
      debug_message("Error in initialization.\n");
      return 1;
   }

   ResourceManager& rm = ResourceManager::getInstance();
   Player *player = (Player *)rm.getData(RES_PLAYER);

   ALLEGRO_AUDIO_STREAM *title_music = (ALLEGRO_AUDIO_STREAM *)rm.getData(RES_TITLE_MUSIC);
   ALLEGRO_AUDIO_STREAM *game_music = (ALLEGRO_AUDIO_STREAM *)rm.getData(RES_GAME_MUSIC);

   for (;;) {
      if (title_music) {
         al_set_audio_stream_playing(title_music, true);
      }

      joypad_find();

      while (true) {
         int result = do_menu();
         al_rest(0.250);
         if (result == 1) {
            do_highscores(INT_MIN);
	    continue;
         }
         else if (result == 2 || result == -1) {
            done();
	    return 0;
         }
         break;
      }

      if (title_music) {
         al_drain_audio_stream(title_music);
         al_rewind_audio_stream(title_music);
      }

      joypad_stop_finding();

      ALLEGRO_DISPLAY *display = (ALLEGRO_DISPLAY *)rm.getData(RES_DISPLAY);
      int o = al_get_display_orientation(display);
      al_set_display_option(display, ALLEGRO_SUPPORTED_ORIENTATIONS, o);

      if (game_music) {
         al_set_audio_stream_playing(game_music, true);
      }

      player->load();
      game_loop();
      do_highscores(player->getScore());
      player->destroy();

      if (game_music) {
         al_drain_audio_stream(game_music);
         al_rewind_audio_stream(game_music);
      }

      al_set_display_option(display, ALLEGRO_SUPPORTED_ORIENTATIONS, ALLEGRO_DISPLAY_ORIENTATION_LANDSCAPE);

   }

   return 0;
}